

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

MIDIDevice * __thiscall MIDIStreamer::CreateMIDIDevice(MIDIStreamer *this,EMidiDevice devtype)

{
  OPLMIDIDevice *this_00;
  
  switch(devtype) {
  case MDEV_MMAPI:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_midistream.cpp"
                  ,0x10b,"MIDIDevice *MIDIStreamer::CreateMIDIDevice(EMidiDevice) const");
  case MDEV_OPL:
    this_00 = (OPLMIDIDevice *)operator_new(0xcf8);
    OPLMIDIDevice::OPLMIDIDevice(this_00,(this->Args).Chars);
    break;
  case MDEV_SNDSYS:
    this_00 = (OPLMIDIDevice *)operator_new(0x18);
    SndSysMIDIDevice::SndSysMIDIDevice((SndSysMIDIDevice *)this_00);
    break;
  case MDEV_TIMIDITY:
    this_00 = (OPLMIDIDevice *)operator_new(0x40);
    TimidityPPMIDIDevice::TimidityPPMIDIDevice((TimidityPPMIDIDevice *)this_00,(this->Args).Chars);
    break;
  case MDEV_FLUIDSYNTH:
    this_00 = (OPLMIDIDevice *)operator_new(0x70);
    FluidSynthMIDIDevice::FluidSynthMIDIDevice((FluidSynthMIDIDevice *)this_00,(this->Args).Chars);
    break;
  case MDEV_GUS:
    this_00 = (OPLMIDIDevice *)operator_new(0x68);
    TimidityMIDIDevice::TimidityMIDIDevice((TimidityMIDIDevice *)this_00,(this->Args).Chars);
    break;
  case MDEV_WILDMIDI:
    this_00 = (OPLMIDIDevice *)operator_new(0x68);
    WildMIDIDevice::WildMIDIDevice((WildMIDIDevice *)this_00,(this->Args).Chars);
    break;
  default:
    this_00 = (OPLMIDIDevice *)0x0;
  }
  return (MIDIDevice *)this_00;
}

Assistant:

MIDIDevice *MIDIStreamer::CreateMIDIDevice(EMidiDevice devtype) const
{
	switch (devtype)
	{
	case MDEV_MMAPI:
#ifdef _WIN32
		return new WinMIDIDevice(mididevice);
#endif
		assert(0);
		// Intentional fall-through for non-Windows systems.

#ifdef HAVE_FLUIDSYNTH
	case MDEV_FLUIDSYNTH:
		return new FluidSynthMIDIDevice(Args);
#endif

	case MDEV_SNDSYS:
		return new SndSysMIDIDevice;

	case MDEV_GUS:
		return new TimidityMIDIDevice(Args);

	case MDEV_OPL:
		try
		{
			return new OPLMIDIDevice(Args);
		}
		catch (CRecoverableError &err)
		{
			// The creation of an OPL MIDI device can abort with an error if no GENMIDI lump can be found.
			Printf("Unable to create OPL MIDI device: %s\nFalling back to Sound System playback", err.GetMessage());
			return new SndSysMIDIDevice;
		}

	case MDEV_TIMIDITY:
		return new TimidityPPMIDIDevice(Args);

	case MDEV_WILDMIDI:
		return new WildMIDIDevice(Args);

	default:
		return NULL;
	}
}